

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::SkipRoutineEM64T<wchar_t>::emit(X86Assembler *as)

{
  anon_union_16_7_ed616b9d_for_Operand__0 local_58;
  Operand_ *local_48;
  Label looplabel;
  
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])((Operand_ *)&looplabel,as);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,(Operand_ *)&looplabel);
  local_48 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
  local_58._packed[0] = (UInt64)1.65781168201985e-316;
  local_58._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_58._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4e0),2);
  local_58._packed[0] = (UInt64)0x3;
  local_58._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x20;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_58._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,(Operand_ *)&looplabel);
  local_58._packed[0] = (UInt64)0x3;
  local_58._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x9;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_58._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,(Operand_ *)&looplabel);
  local_58._packed[0] = (UInt64)0x3;
  local_58._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0xa;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_58._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,(Operand_ *)&looplabel);
  local_58._packed[0] = (UInt64)0x3;
  local_58._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0xd;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_58._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,(Operand_ *)&looplabel);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2c4,local_48,2);
  return;
}

Assistant:

void SkipRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as)
{
    asmjit::Label looplabel = as.newLabel();

    as.bind(looplabel);

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    as.cmp(CHAR_REG, asmjit::Imm(' '));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\t'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\n'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\r'));
    as.je(looplabel);

    if (sizeof(TCHAR) == 1)
        as.dec(INPUT_REG);
    else
        as.sub(INPUT_REG, 2);

    /*as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
    as.pcmpistri(PATTERN_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
    if (sizeof(TCHAR) == 2)
        as.sal(INDEX_REG, 1);
    as.add(INPUT_REG, INDEX_REG);
    as.cmp(INDEX_REG, 15);
    as.jg(looplabel);*/
}